

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void resched_stream_data(quicly_stream_t *stream)

{
  byte bVar1;
  long *in_RDI;
  quicly_stream_scheduler_t *scheduler;
  uint8_t mask;
  
  if (in_RDI[1] < 0) {
    if (in_RDI[1] < -4) {
      __assert_fail("-4 <= stream->stream_id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x341,"void resched_stream_data(quicly_stream_t *)");
    }
    bVar1 = (byte)(1 << (-((char)in_RDI[1] + '\x01') & 0x1fU));
    if (in_RDI[9] == 0) {
      *(byte *)(*in_RDI + 0x7bc) = *(byte *)(*in_RDI + 0x7bc) & (bVar1 ^ 0xff);
    }
    else {
      *(byte *)(*in_RDI + 0x7bc) = *(byte *)(*in_RDI + 0x7bc) | bVar1;
    }
  }
  else if ((*(byte *)(in_RDI + 0x17) & 1) == 0) {
    (**(code **)(*(long *)(*(long *)*in_RDI + 0xb8) + 0x10))
              (*(long *)(*(long *)*in_RDI + 0xb8),in_RDI);
  }
  return;
}

Assistant:

static void resched_stream_data(quicly_stream_t *stream)
{
    if (stream->stream_id < 0) {
        assert(-4 <= stream->stream_id);
        uint8_t mask = 1 << -(1 + stream->stream_id);
        if (stream->sendstate.pending.num_ranges != 0) {
            stream->conn->egress.pending_flows |= mask;
        } else {
            stream->conn->egress.pending_flows &= ~mask;
        }
        return;
    }

    /* do nothing if blocked */
    if (stream->streams_blocked)
        return;

    quicly_stream_scheduler_t *scheduler = stream->conn->super.ctx->stream_scheduler;
    scheduler->update_state(scheduler, stream);
}